

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_struct_sync_write
          (t_rs_generator *this,t_struct *tstruct,e_struct_type struct_type)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_field *tfield;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_type *psVar6;
  e_req req;
  t_rs_generator *ptVar7;
  _Alloc_hider _Var8;
  string member_var;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  undefined1 local_98 [32];
  string local_78;
  ofstream_with_content_based_conditional_update *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  ptVar7 = (t_rs_generator *)local_98._0_8_;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_98._0_8_,local_98._8_8_);
  visibility_qualifier_abi_cxx11_(&local_78,ptVar7,struct_type);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  ptVar7 = (t_rs_generator *)(local_98 + 0x10);
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_98._0_8_,local_98._8_8_);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::operator+(&local_50,"let struct_ident = TStructIdentifier::new(\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar3));
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78.field_2._8_8_ = plVar5[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_78._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_98._0_8_,local_98._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"o_prot.write_struct_begin(&struct_ident)?;",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_58 = poVar1;
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&local_50,
             &tstruct->members_in_id_order_);
  if (local_50._M_dataplus._M_p != (pointer)local_50._M_string_length) {
    _Var8._M_p = local_50._M_dataplus._M_p;
    do {
      tfield = *(t_field **)_Var8._M_p;
      req = T_REQUIRED;
      if (struct_type != T_ARGS) {
        req = tfield->req_;
      }
      rust_field_name_abi_cxx11_(&local_78,this,tfield);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x3a9b27);
      local_98._0_8_ = local_98 + 0x10;
      ptVar7 = (t_rs_generator *)(plVar5 + 2);
      if ((t_rs_generator *)*plVar5 == ptVar7) {
        local_98._16_8_ = (ptVar7->super_t_generator)._vptr_t_generator;
        local_98._24_8_ = plVar5[3];
      }
      else {
        local_98._16_8_ = (ptVar7->super_t_generator)._vptr_t_generator;
        local_98._0_8_ = (t_rs_generator *)*plVar5;
      }
      local_98._8_8_ = plVar5[1];
      *plVar5 = (long)ptVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      render_struct_field_sync_write(this,(string *)local_98,false,tfield,req);
      if ((t_rs_generator *)local_98._0_8_ != (t_rs_generator *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      _Var8._M_p = _Var8._M_p + 8;
    } while (_Var8._M_p != (pointer)local_50._M_string_length);
  }
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar1 = local_58;
  ptVar7 = (t_rs_generator *)(local_98 + 0x10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_58,(char *)local_98._0_8_,local_98._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"o_prot.write_field_stop()?;",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_98._0_8_,local_98._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"o_prot.write_struct_end()",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_98._0_8_,local_98._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_rs_generator *)local_98._0_8_ != ptVar7) {
    operator_delete((void *)local_98._0_8_);
  }
  if (local_50._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::render_struct_sync_write(
    t_struct *tstruct,
    t_rs_generator::e_struct_type struct_type
) {
  f_gen_
    << indent()
    << visibility_qualifier(struct_type)
    << "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();

  // write struct header to output protocol
  // note: use the *original* struct name here
  f_gen_ << indent() << "let struct_ident = TStructIdentifier::new(\"" + tstruct->get_name() + "\");" << endl;
  f_gen_ << indent() << "o_prot.write_struct_begin(&struct_ident)?;" << endl;

  // write struct members to output protocol
  vector<t_field*> members = tstruct->get_sorted_members();
  if (!members.empty()) {
    vector<t_field*>::iterator members_iter;
    for(members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* member = (*members_iter);
      t_field::e_req member_req = actual_field_req(member, struct_type);
      string member_var("self." + rust_field_name(member));
      render_struct_field_sync_write(member_var, false, member, member_req);
    }
  }

  // write struct footer to output protocol
  f_gen_ << indent() << "o_prot.write_field_stop()?;" << endl;
  f_gen_ << indent() << "o_prot.write_struct_end()" << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
}